

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int agginfoPersistExprCb(Walker *pWalker,Expr *pExpr)

{
  short sVar1;
  AggInfo *pAVar2;
  Parse *pParse;
  sqlite3 *db;
  Expr *pPtr;
  AggInfo *pAggInfo;
  
  if (((pExpr->flags & 0x14000) == 0) && (pAVar2 = pExpr->pAggInfo, pAVar2 != (AggInfo *)0x0)) {
    sVar1 = pExpr->iAgg;
    pParse = pWalker->pParse;
    db = pParse->db;
    if (pExpr->op == 0xa8) {
      if (pAVar2->aFunc[sVar1].pFExpr != pExpr) {
        return 0;
      }
      pPtr = exprDup(db,pExpr,0,(u8 **)0x0);
      if (pPtr == (Expr *)0x0) {
        return 0;
      }
      pAVar2->aFunc[sVar1].pFExpr = pPtr;
    }
    else {
      if (pAVar2->aCol[sVar1].pCExpr != pExpr) {
        return 0;
      }
      pPtr = exprDup(db,pExpr,0,(u8 **)0x0);
      if (pPtr == (Expr *)0x0) {
        return 0;
      }
      pAVar2->aCol[sVar1].pCExpr = pPtr;
    }
    sqlite3ParserAddCleanup(pParse,sqlite3ExprDelete,pPtr);
  }
  return 0;
}

Assistant:

static int agginfoPersistExprCb(Walker *pWalker, Expr *pExpr){
  if( ALWAYS(!ExprHasProperty(pExpr, EP_TokenOnly|EP_Reduced))
   && pExpr->pAggInfo!=0
  ){
    AggInfo *pAggInfo = pExpr->pAggInfo;
    int iAgg = pExpr->iAgg;
    Parse *pParse = pWalker->pParse;
    sqlite3 *db = pParse->db;
    if( pExpr->op!=TK_AGG_FUNCTION ){
      assert( pExpr->op==TK_AGG_COLUMN || pExpr->op==TK_IF_NULL_ROW );
      assert( iAgg>=0 && iAgg<pAggInfo->nColumn );
      if( pAggInfo->aCol[iAgg].pCExpr==pExpr ){
        pExpr = sqlite3ExprDup(db, pExpr, 0);
        if( pExpr ){
          pAggInfo->aCol[iAgg].pCExpr = pExpr;
          sqlite3ExprDeferredDelete(pParse, pExpr);
        }
      }
    }else{
      assert( pExpr->op==TK_AGG_FUNCTION );
      assert( iAgg>=0 && iAgg<pAggInfo->nFunc );
      if( pAggInfo->aFunc[iAgg].pFExpr==pExpr ){
        pExpr = sqlite3ExprDup(db, pExpr, 0);
        if( pExpr ){
          pAggInfo->aFunc[iAgg].pFExpr = pExpr;
          sqlite3ExprDeferredDelete(pParse, pExpr);
        }
      }
    }
  }
  return WRC_Continue;
}